

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# capability.c++
# Opt level: O2

Own<capnp::ClientHook> __thiscall
capnp::QueuedPipeline::getPipelinedCap(QueuedPipeline *this,Array<capnp::PipelineOp> *ops)

{
  PipelineOp *pPVar1;
  TransformPromiseNodeBase *this_00;
  undefined8 *in_RDX;
  ClientHook *extraout_RDX;
  ClientHook *extraout_RDX_00;
  ClientHook *pCVar2;
  Own<capnp::ClientHook> OVar3;
  PromiseForResult<kj::CaptureByMove<(lambda_at__workspace_llm4binary_github_license_all_cmakelists_25_Cosmic_Sans[P]capnproto_c___src_capnp_capability_c__:411:9),_kj::Array<capnp::PipelineOp>_>,_kj::Own<capnp::PipelineHook>_>
  clientPromise;
  Own<kj::_::PromiseNode> local_68;
  Own<kj::_::PromiseNode> local_58;
  undefined1 local_48 [16];
  PromiseNode *pPStack_38;
  void *local_30;
  Own<kj::_::PromiseNode> local_28;
  
  pPVar1 = ops[2].ptr;
  if (pPVar1 == (PipelineOp *)0x0) {
    kj::ForkedPromise<kj::Own<capnp::PipelineHook>_>::addBranch
              ((ForkedPromise<kj::Own<capnp::PipelineHook>_> *)&local_68);
    local_48._8_8_ = *in_RDX;
    pPStack_38 = (PromiseNode *)in_RDX[1];
    local_30 = (void *)in_RDX[2];
    *in_RDX = 0;
    in_RDX[1] = 0;
    this_00 = (TransformPromiseNodeBase *)operator_new(0x48);
    kj::_::TransformPromiseNodeBase::TransformPromiseNodeBase
              (this_00,&local_68,
               kj::
               CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::$_0,kj::Array<capnp::PipelineOp>>
               ::operator());
    (this_00->super_PromiseNode)._vptr_PromiseNode = (_func_int **)&PTR_onReady_003a02a0;
    this_00[1].dependency.disposer = (Disposer *)local_48._8_8_;
    this_00[1].dependency.ptr = pPStack_38;
    this_00[1].continuationTracePtr = local_30;
    local_48._8_8_ = (QueuedClient *)0x0;
    pPStack_38 = (PromiseNode *)0x0;
    local_58.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::Own<capnp::PipelineHook>,kj::CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::$_0,kj::Array<capnp::PipelineOp>>,kj::_::PropagateException>>
          ::instance;
    local_28.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::Own<capnp::PipelineHook>,kj::CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::$_0,kj::Array<capnp::PipelineOp>>,kj::_::PropagateException>>
          ::instance;
    local_58.ptr = (PromiseNode *)0x0;
    clientPromise.super_PromiseBase.node.disposer =
         (Disposer *)
         &kj::_::
          HeapDisposer<kj::_::TransformPromiseNode<kj::Own<capnp::ClientHook>,kj::Own<capnp::PipelineHook>,kj::CaptureByMove<capnp::QueuedPipeline::getPipelinedCap(kj::Array<capnp::PipelineOp>&&)::$_0,kj::Array<capnp::PipelineOp>>,kj::_::PropagateException>>
          ::instance;
    local_28.ptr = (PromiseNode *)0x0;
    clientPromise.super_PromiseBase.node.ptr = (PromiseNode *)this_00;
    kj::Own<kj::_::PromiseNode>::dispose(&local_28);
    kj::Own<kj::_::PromiseNode>::dispose(&local_58);
    kj::Array<capnp::PipelineOp>::~Array((Array<capnp::PipelineOp> *)(local_48 + 8));
    kj::Own<kj::_::PromiseNode>::dispose(&local_68);
    kj::refcounted<capnp::QueuedClient,kj::Promise<kj::Own<capnp::ClientHook>>>
              ((kj *)local_48,&clientPromise);
    (this->super_PipelineHook)._vptr_PipelineHook = (_func_int **)local_48._0_8_;
    (this->super_Refcounted).super_Disposer._vptr_Disposer = (_func_int **)local_48._8_8_;
    local_48._8_8_ = (QueuedClient *)0x0;
    kj::Own<capnp::QueuedClient>::dispose((Own<capnp::QueuedClient> *)local_48);
    kj::Own<kj::_::PromiseNode>::dispose((Own<kj::_::PromiseNode> *)&clientPromise);
    pCVar2 = extraout_RDX_00;
  }
  else {
    (**(code **)((long)*pPVar1 + 0x10))(this,pPVar1);
    pCVar2 = extraout_RDX;
  }
  OVar3.ptr = pCVar2;
  OVar3.disposer = (Disposer *)this;
  return OVar3;
}

Assistant:

kj::Own<ClientHook> QueuedPipeline::getPipelinedCap(kj::Array<PipelineOp>&& ops) {
  KJ_IF_MAYBE(r, redirect) {
    return r->get()->getPipelinedCap(kj::mv(ops));
  } else {
    auto clientPromise = promise.addBranch().then(kj::mvCapture(ops,
        [](kj::Array<PipelineOp>&& ops, kj::Own<PipelineHook> pipeline) {
          return pipeline->getPipelinedCap(kj::mv(ops));
        }));

    return kj::refcounted<QueuedClient>(kj::mv(clientPromise));
  }